

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::MustBeInDebugMode(FunctionBody *this)

{
  byte bVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  void *pvVar6;
  
  pUVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar1 = pUVar2->field_0xa8;
  if ((byte)((bVar1 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6) ==
      0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f4,"(GetUtf8SourceInfo()->IsInDebugMode())",
                                "GetUtf8SourceInfo()->IsInDebugMode()");
    if (!bVar4) goto LAB_00769e9a;
    *puVar5 = 0;
  }
  if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f5,"(m_sourceInfo.pSpanSequence == nullptr)",
                                "m_sourceInfo.pSpanSequence == nullptr");
    if (!bVar4) goto LAB_00769e9a;
    *puVar5 = 0;
  }
  pvVar6 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (pvVar6 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f6,"(this->GetStatementMaps() != nullptr)",
                                "this->GetStatementMaps() != nullptr");
    if (!bVar4) {
LAB_00769e9a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void FunctionBody::MustBeInDebugMode()
    {
        Assert(GetUtf8SourceInfo()->IsInDebugMode());
        Assert(m_sourceInfo.pSpanSequence == nullptr);
        Assert(this->GetStatementMaps() != nullptr);
    }